

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O1

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::QuadMv<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::QuadMv<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  uint uVar9;
  FastAllocator *this_00;
  ThreadLocal *pTVar10;
  ThreadLocal2 *this_01;
  iterator __position;
  QuadMesh *pQVar11;
  BuildPrim *pBVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  size_t sVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar23;
  undefined1 auVar24 [12];
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  vuint4 vprimID;
  vuint4 vgeomID;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  CreateMortonLeaf<4,_embree::QuadMv<4>_> *local_60;
  uint local_58 [10];
  
  uVar7 = current->_begin;
  uVar8 = current->_end;
  this_00 = alloc->alloc;
  pTVar10 = alloc->talloc1;
  local_f8._8_8_ = local_f8._0_8_;
  local_f8._0_8_ = 0xe0;
  this_01 = pTVar10->parent;
  local_60 = this;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_c8[8] = 1;
    local_c8._0_8_ = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_98._0_8_ = this_01;
    local_128[8] = 1;
    local_128._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,(ThreadLocal2 **)local_98);
    }
    else {
      *__position._M_current = (ThreadLocal2 *)local_98._0_8_;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (local_128[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_128._0_8_);
    }
    if (local_c8[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_c8._0_8_);
    }
  }
  pTVar10->bytesUsed = pTVar10->bytesUsed + local_f8._0_8_;
  sVar18 = pTVar10->cur;
  uVar20 = (ulong)(-(int)sVar18 & 0xf);
  uVar16 = sVar18 + local_f8._0_8_ + uVar20;
  pTVar10->cur = uVar16;
  if (pTVar10->end < uVar16) {
    pTVar10->cur = sVar18;
    if (pTVar10->allocBlockSize < (ulong)(local_f8._0_8_ << 2)) {
      pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)local_f8);
    }
    else {
      local_128._0_8_ = pTVar10->allocBlockSize;
      pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)local_128);
      pTVar10->ptr = pcVar17;
      sVar18 = (pTVar10->end - pTVar10->cur) + pTVar10->bytesWasted;
      pTVar10->bytesWasted = sVar18;
      pTVar10->cur = 0;
      pTVar10->end = local_128._0_8_;
      pTVar10->cur = local_f8._0_8_;
      if ((ulong)local_128._0_8_ < (ulong)local_f8._0_8_) {
        pTVar10->cur = 0;
        local_128._0_8_ = pTVar10->allocBlockSize;
        pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)local_128);
        pTVar10->ptr = pcVar17;
        sVar18 = (pTVar10->end - pTVar10->cur) + pTVar10->bytesWasted;
        pTVar10->bytesWasted = sVar18;
        pTVar10->cur = 0;
        pTVar10->end = local_128._0_8_;
        pTVar10->cur = local_f8._0_8_;
        if ((ulong)local_128._0_8_ < (ulong)local_f8._0_8_) {
          pTVar10->cur = 0;
          pcVar17 = (char *)0x0;
          goto LAB_00ccb9d1;
        }
      }
      pTVar10->bytesWasted = sVar18;
    }
  }
  else {
    pTVar10->bytesWasted = pTVar10->bytesWasted + uVar20;
    pcVar17 = pTVar10->ptr + (uVar16 - local_f8._0_8_);
  }
LAB_00ccb9d1:
  local_58[4] = 0xffffffff;
  local_58[5] = 0xffffffff;
  local_58[6] = 0xffffffff;
  local_58[7] = 0xffffffff;
  local_58[0] = 0xffffffff;
  local_58[1] = 0xffffffff;
  local_58[2] = 0xffffffff;
  local_58[3] = 0xffffffff;
  local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  if (uVar8 == uVar7) {
    auVar24 = DAT_01feb9f0._0_12_;
    aVar23 = _DAT_01feba00;
  }
  else {
    iVar19 = uVar8 - uVar7;
    pQVar11 = local_60->mesh;
    pBVar12 = local_60->morton;
    lVar13 = *(long *)&(pQVar11->super_Geometry).field_0x58;
    lVar14 = *(long *)&pQVar11->field_0x68;
    pcVar15 = (pQVar11->vertices0).super_RawBufferView.ptr_ofs;
    sVar18 = (pQVar11->vertices0).super_RawBufferView.stride;
    uVar8 = local_60->geomID_;
    lVar21 = 0;
    aVar23 = _DAT_01feba00;
    auVar25 = _DAT_01feb9f0;
    do {
      uVar9 = *(uint *)((long)&pBVar12[uVar7].field_0 + lVar21 * 2 + 4);
      lVar22 = (ulong)uVar9 * lVar14;
      auVar3 = *(undefined1 (*) [16])(pcVar15 + *(uint *)(lVar13 + lVar22) * sVar18);
      auVar4 = *(undefined1 (*) [16])(pcVar15 + *(uint *)(lVar13 + 4 + lVar22) * sVar18);
      auVar5 = *(undefined1 (*) [16])(pcVar15 + *(uint *)(lVar13 + 8 + lVar22) * sVar18);
      auVar6 = *(undefined1 (*) [16])(pcVar15 + *(uint *)(lVar13 + 0xc + lVar22) * sVar18);
      auVar25 = minps(auVar25,auVar3);
      auVar27 = minps(auVar4,auVar5);
      auVar25 = minps(auVar25,auVar27);
      auVar25 = minps(auVar25,auVar6);
      auVar24 = auVar25._0_12_;
      auVar27 = maxps((undefined1  [16])aVar23,auVar3);
      auVar28 = maxps(auVar4,auVar5);
      auVar27 = maxps(auVar27,auVar28);
      aVar23 = (anon_union_16_2_47237d3f_for_Vec3fx_0)maxps(auVar27,auVar6);
      *(uint *)((long)local_58 + lVar21 + 0x10) = uVar8;
      *(uint *)((long)local_58 + lVar21) = uVar9;
      *(int *)(local_128 + lVar21) = auVar3._0_4_;
      *(int *)(local_118 + lVar21) = auVar3._4_4_;
      *(int *)(local_108 + lVar21) = auVar3._8_4_;
      *(int *)(local_c8 + lVar21) = auVar4._0_4_;
      *(int *)(local_b8 + lVar21) = auVar4._4_4_;
      *(int *)(local_a8 + lVar21) = auVar4._8_4_;
      *(int *)(local_98 + lVar21) = auVar5._0_4_;
      *(int *)(local_88 + lVar21) = auVar5._4_4_;
      *(int *)(local_78 + lVar21) = auVar5._8_4_;
      *(int *)(local_f8 + lVar21) = auVar6._0_4_;
      *(int *)(local_e8 + lVar21) = auVar6._4_4_;
      *(int *)(local_d8 + lVar21) = auVar6._8_4_;
      lVar21 = lVar21 + 4;
    } while ((ulong)(iVar19 + (uint)(iVar19 == 0)) << 2 != lVar21);
  }
  *(undefined8 *)pcVar17 = local_128._0_8_;
  *(undefined8 *)(pcVar17 + 8) = local_128._8_8_;
  *(undefined8 *)(pcVar17 + 0x10) = local_118._0_8_;
  *(undefined8 *)(pcVar17 + 0x18) = local_118._8_8_;
  *(undefined8 *)(pcVar17 + 0x20) = local_108._0_8_;
  *(undefined8 *)(pcVar17 + 0x28) = local_108._8_8_;
  *(undefined8 *)(pcVar17 + 0x30) = local_c8._0_8_;
  *(undefined8 *)(pcVar17 + 0x38) = local_c8._8_8_;
  *(undefined8 *)(pcVar17 + 0x40) = local_b8._0_8_;
  *(undefined8 *)(pcVar17 + 0x48) = local_b8._8_8_;
  *(undefined8 *)(pcVar17 + 0x50) = local_a8._0_8_;
  *(undefined8 *)(pcVar17 + 0x58) = local_a8._8_8_;
  *(undefined8 *)(pcVar17 + 0x60) = local_98._0_8_;
  *(undefined8 *)(pcVar17 + 0x68) = local_98._8_8_;
  *(undefined8 *)(pcVar17 + 0x70) = local_88._0_8_;
  *(undefined8 *)(pcVar17 + 0x78) = local_88._8_8_;
  *(undefined8 *)(pcVar17 + 0x80) = local_78._0_8_;
  *(undefined8 *)(pcVar17 + 0x88) = local_78._8_8_;
  *(undefined8 *)(pcVar17 + 0x90) = local_f8._0_8_;
  *(undefined8 *)(pcVar17 + 0x98) = local_f8._8_8_;
  *(undefined8 *)(pcVar17 + 0xa0) = local_e8._0_8_;
  *(undefined8 *)(pcVar17 + 0xa8) = local_e8._8_8_;
  *(undefined8 *)(pcVar17 + 0xb0) = local_d8._0_8_;
  *(undefined8 *)(pcVar17 + 0xb8) = local_d8._8_8_;
  *(ulong *)(pcVar17 + 0xc0) = CONCAT44(local_58[5],local_58[4]);
  *(ulong *)(pcVar17 + 200) = CONCAT44(local_58[7],local_58[6]);
  *(ulong *)(pcVar17 + 0xd0) = CONCAT44(local_58[1],local_58[0]);
  *(ulong *)(pcVar17 + 0xd8) = CONCAT44(local_58[3],local_58[2]);
  aVar26.m128[3] = (float)(current->_end - current->_begin);
  aVar26._0_12_ = auVar24;
  (__return_storage_ptr__->ref).ptr = (ulong)pcVar17 | 9;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar26;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar23;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Quad4v* accel = (Quad4v*) alloc.malloc1(sizeof(Quad4v),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);
        
        vuint4 vgeomID = -1, vprimID = -1;
        Vec3vf4 v0 = zero, v1 = zero, v2 = zero, v3 = zero;
        const QuadMesh* __restrict__ mesh = this->mesh;

        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const QuadMesh::Quad& tri = mesh->quad(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          const Vec3fa& p3 = mesh->vertex(tri.v[3]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2,(vfloat4)p3);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2,(vfloat4)p3);
          vgeomID [i] = geomID_;
          vprimID [i] = primID;
          v0.x[i] = p0.x; v0.y[i] = p0.y; v0.z[i] = p0.z;
          v1.x[i] = p1.x; v1.y[i] = p1.y; v1.z[i] = p1.z;
          v2.x[i] = p2.x; v2.y[i] = p2.y; v2.z[i] = p2.z;
          v3.x[i] = p3.x; v3.y[i] = p3.y; v3.z[i] = p3.z;
        }
        Quad4v::store_nt(accel,Quad4v(v0,v1,v2,v3,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }